

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O3

Interaction * __thiscall
phyr::Sphere::sample
          (Interaction *__return_storage_ptr__,Sphere *this,Interaction *ref,Point2f *u,double *pdf)

{
  Transform *pTVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  int i;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  Point3f op;
  double local_148 [4];
  double local_128;
  undefined8 uStack_120;
  double local_118;
  double local_110;
  double local_108 [4];
  undefined1 local_e8 [16];
  double local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  double local_b8;
  double dStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  
  pTVar1 = (this->super_Shape).localToWorld;
  dVar12 = (pTVar1->mat).d[0][2] * 0.0 + (pTVar1->mat).d[0][0] * 0.0 + (pTVar1->mat).d[0][1] * 0.0 +
           (pTVar1->mat).d[0][3];
  dVar16 = (pTVar1->mat).d[3][2] * 0.0 + (pTVar1->mat).d[3][0] * 0.0 + (pTVar1->mat).d[3][1] * 0.0 +
           (pTVar1->mat).d[3][3];
  uVar7 = -(uint)(dVar16 == 1.0) & 1;
  dVar15 = 1.0 / dVar16;
  local_78 = dVar12 * dVar15;
  if ((dVar16 == 1.0) && (!NAN(dVar16))) {
    local_78 = dVar12;
  }
  dVar12 = (ref->p).x;
  local_128 = local_78 - dVar12;
  dVar16 = (pTVar1->mat).d[1][2] * 0.0 + (pTVar1->mat).d[1][0] * 0.0 + (pTVar1->mat).d[1][1] * 0.0 +
           (pTVar1->mat).d[1][3];
  dVar10 = (pTVar1->mat).d[2][2] * 0.0 + (pTVar1->mat).d[2][0] * 0.0 + (pTVar1->mat).d[2][1] * 0.0 +
           (pTVar1->mat).d[2][3];
  auVar21._0_8_ = CONCAT44((int)(uVar7 << 0x1f) >> 0x1f,(int)(uVar7 << 0x1f) >> 0x1f);
  auVar21._8_4_ = (int)(uVar7 << 0x1f) >> 0x1f;
  auVar21._12_4_ = (int)(uVar7 << 0x1f) >> 0x1f;
  local_68 = (double)(~auVar21._0_8_ & (ulong)(dVar15 * dVar16) | (ulong)dVar16 & auVar21._0_8_);
  local_98 = (double)(~auVar21._8_8_ & (ulong)(dVar15 * dVar10) | (ulong)dVar10 & auVar21._8_8_);
  dVar16 = (ref->p).y;
  dStack_80 = (ref->p).z;
  local_38 = local_68 - dVar16;
  dVar14 = local_98 - dStack_80;
  dVar15 = (ref->n).z;
  dVar10 = (ref->n).x;
  dVar5 = (ref->n).y;
  local_108[2] = (ABS(dVar10) * (ref->pfError).x + ABS(dVar5) * (ref->pfError).y +
                 ABS(dVar15) * (ref->pfError).z) * 1024.0;
  local_108[0] = local_108[2] * dVar10;
  local_108[1] = local_108[2] * dVar5;
  local_108[2] = local_108[2] * dVar15;
  uStack_120 = 0;
  if (dVar15 * dVar14 + dVar10 * local_128 + local_38 * dVar5 < 0.0) {
    local_108[0] = -local_108[0];
    local_108[1] = -local_108[1];
    local_108[2] = -local_108[2];
  }
  local_148[0] = dVar12 + local_108[0];
  local_148[1] = dVar16 + local_108[1];
  local_148[2] = dStack_80 + local_108[2];
  iVar6 = 0;
  do {
    lVar8 = 0;
    if (iVar6 != 0) {
      lVar8 = (ulong)(iVar6 != 1) * 8 + 8;
    }
    if (*(double *)((long)local_108 + lVar8) <= 0.0) {
      if (*(double *)((long)local_108 + lVar8) < 0.0) {
        dVar15 = *(double *)((long)local_148 + lVar8);
        lVar9 = -0x10000000000000;
        if (-INFINITY < dVar15) {
          dVar15 = (double)(~-(ulong)(dVar15 == 0.0) & (ulong)dVar15 |
                           -(ulong)(dVar15 == 0.0) & 0x8000000000000000);
          lVar9 = (long)dVar15 + (ulong)(dVar15 <= 0.0) * 2 + -1;
        }
        goto LAB_00133b4d;
      }
    }
    else {
      dVar15 = *(double *)((long)local_148 + lVar8);
      lVar9 = 0x7ff0000000000000;
      if (dVar15 < INFINITY) {
        dVar15 = (double)(~-(ulong)(dVar15 == 0.0) & (ulong)dVar15);
        lVar9 = (-(ulong)(dVar15 < 0.0) | 1) + (long)dVar15;
      }
LAB_00133b4d:
      *(long *)((long)local_148 + lVar8) = lVar9;
    }
    iVar6 = iVar6 + 1;
    if (iVar6 == 3) {
      dVar15 = this->radius;
      dVar10 = dVar15 * dVar15;
      if ((local_148[2] - local_98) * (local_148[2] - local_98) +
          (local_148[0] - local_78) * (local_148[0] - local_78) +
          (local_148[1] - local_68) * (local_148[1] - local_68) <= dVar10) {
        (*(this->super_Shape)._vptr_Shape[7])(__return_storage_ptr__,this,u,pdf);
        dVar12 = (__return_storage_ptr__->p).x;
        dVar15 = (__return_storage_ptr__->p).y;
        dVar16 = (ref->p).x;
        dVar10 = (ref->p).y;
        dVar4 = dVar12 - dVar16;
        dVar11 = dVar15 - dVar10;
        dVar5 = (__return_storage_ptr__->p).z;
        dVar14 = (ref->p).z;
        dVar13 = dVar5 - dVar14;
        dVar19 = dVar13 * dVar13 + dVar4 * dVar4 + dVar11 * dVar11;
        dVar20 = 0.0;
        if ((dVar19 != 0.0) || (NAN(dVar19))) {
          dVar20 = 1.0 / SQRT(dVar19);
          dVar16 = dVar16 - dVar12;
          dVar10 = dVar10 - dVar15;
          dVar14 = dVar14 - dVar5;
          dVar20 = ((dVar14 * dVar14 + dVar16 * dVar16 + dVar10 * dVar10) /
                   ABS((-dVar4 * dVar20 * (__return_storage_ptr__->n).x -
                       dVar11 * dVar20 * (__return_storage_ptr__->n).y) -
                       dVar20 * dVar13 * (__return_storage_ptr__->n).z)) * *pdf;
        }
        if (ABS(dVar20) == INFINITY) {
          dVar20 = 0.0;
        }
      }
      else {
        local_48 = 1.0 / SQRT(dVar14 * dVar14 + local_128 * local_128 + local_38 * local_38);
        local_128 = local_128 * local_48;
        local_38 = local_48 * local_38;
        local_48 = local_48 * dVar14;
        if (ABS(local_128) <= ABS(local_38)) {
          dVar14 = 1.0 / SQRT(local_38 * local_38 + local_48 * local_48);
          uVar17 = SUB84(local_48,0);
          uVar18 = (undefined4)((ulong)local_48 >> 0x20);
          dVar5 = local_48 * dVar14;
          local_58 = -local_38;
          dStack_50 = 0.0;
        }
        else {
          dVar14 = 1.0 / SQRT(local_128 * local_128 + local_48 * local_48);
          uVar17 = 0;
          uVar18 = 0;
          dVar5 = dVar14 * 0.0;
          dStack_50 = -local_48;
          local_58 = local_128;
        }
        dStack_b0 = -local_48;
        local_b8 = -local_38;
        local_58 = local_58 * dVar14;
        dStack_50 = dStack_50 * dVar14;
        local_c8._8_4_ = uVar17;
        local_c8._0_8_ = dVar5;
        local_c8._12_4_ = uVar18;
        dVar12 = (dStack_80 - local_98) * (dStack_80 - local_98) +
                 (dVar12 - local_78) * (dVar12 - local_78) +
                 (dVar16 - local_68) * (dVar16 - local_68);
        local_110 = 1.0 - dVar10 / dVar12;
        if (local_110 <= 0.0) {
          local_110 = 0.0;
        }
        local_110 = SQRT(local_110);
        dVar14 = u->x * local_110 + (1.0 - u->x);
        dVar16 = 1.0 - dVar14 * dVar14;
        if (dVar16 <= 0.0) {
          dVar16 = 0.0;
        }
        dVar12 = SQRT(dVar12);
        dVar16 = dVar10 - SQRT(dVar16) * dVar12 * dVar12 * SQRT(dVar16);
        if (dVar16 <= 0.0) {
          dVar16 = 0.0;
        }
        dVar16 = dVar14 * dVar12 - SQRT(dVar16);
        local_88 = ((dVar12 * dVar12 + dVar10) - dVar16 * dVar16) / (dVar15 * (dVar12 + dVar12));
        local_148[3] = 1.0 - local_88 * local_88;
        local_a8 = -local_128;
        uStack_a0 = 0x8000000000000000;
        if (local_148[3] <= 0.0) {
          local_148[3] = 0.0;
        }
        local_118 = (u->y + u->y) * 3.141592653589793;
        local_148[3] = SQRT(local_148[3]);
        local_d8 = -(local_128 * dVar5 + dStack_50 * local_b8);
        uStack_d0 = 0x8000000000000000;
        uStack_70 = 0;
        dStack_90 = local_98;
        dStack_60 = local_98;
        dStack_40 = local_48;
        dStack_30 = local_48;
        dVar12 = cos(local_118);
        local_e8._8_4_ = extraout_XMM0_Dc;
        local_e8._0_8_ = dVar12 * local_148[3];
        local_e8._12_4_ = extraout_XMM0_Dd;
        dVar12 = sin(local_118);
        dVar12 = dVar12 * local_148[3];
        dVar15 = (dVar12 * -(local_38 * local_58 + dStack_b0 * (double)local_c8._0_8_) -
                 (double)local_e8._0_8_ * dStack_50) - local_88 * local_128;
        dVar16 = (dVar12 * -(dStack_30 * dStack_50 + local_a8 * local_58) -
                 (double)local_e8._0_8_ * (double)local_c8._0_8_) - local_88 * local_38;
        uVar7 = (uint)((ulong)dVar16 >> 0x20);
        dVar10 = (local_d8 * dVar12 - local_58 * (double)local_e8._0_8_) - local_48 * local_88;
        dVar12 = this->radius;
        local_98 = dVar12 * dVar10 + local_98;
        (__return_storage_ptr__->wo).x = 0.0;
        (__return_storage_ptr__->wo).y = 0.0;
        (__return_storage_ptr__->wo).z = 0.0;
        local_78 = local_78 + dVar12 * dVar15;
        local_68 = local_68 + dVar12 * dVar16;
        (__return_storage_ptr__->p).x = local_78;
        (__return_storage_ptr__->p).y = local_68;
        (__return_storage_ptr__->p).z = local_98;
        (__return_storage_ptr__->pfError).x = ABS(local_78) * 5.551115123125786e-16;
        (__return_storage_ptr__->pfError).y = ABS(local_68) * 5.551115123125786e-16;
        (__return_storage_ptr__->pfError).z = ABS(local_98) * 5.551115123125786e-16;
        auVar2._8_4_ = SUB84(dVar16,0);
        auVar2._0_8_ = dVar15;
        auVar2._12_4_ = uVar7;
        (__return_storage_ptr__->n).x = dVar15;
        (__return_storage_ptr__->n).y = (double)auVar2._8_8_;
        (__return_storage_ptr__->n).z = dVar10;
        if ((this->super_Shape).reverseNormals == true) {
          auVar3._8_4_ = SUB84(dVar16,0);
          auVar3._0_8_ = -dVar15;
          auVar3._12_4_ = uVar7 ^ 0x80000000;
          (__return_storage_ptr__->n).x = -dVar15;
          (__return_storage_ptr__->n).y = (double)auVar3._8_8_;
          (__return_storage_ptr__->n).z = -dVar10;
        }
        dVar20 = 1.0 / ((1.0 - local_110) * 6.283185307179586);
      }
      *pdf = dVar20;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Interaction Sphere::sample(const Interaction& ref, const Point2f& u,
                           Real* pdf) const {
    Point3f pCenter = (*localToWorld)(Point3f(0, 0, 0));

    // Sample uniformly on sphere if $\pt{}$ is inside it
    Point3f pOrigin = offsetRayOrigin(ref.p, ref.n, pCenter - ref.p, ref.pfError);

    if (distanceSquared(pOrigin, pCenter) <= radius * radius) {
        Interaction intr = sample(u, pdf);
        Vector3f wi = intr.p - ref.p;
        if (wi.lengthSquared() == 0) {
            *pdf = 0;
        } else {
            // Convert from area measure returned by Sample() call above to
            // solid angle measure.
            wi = normalize(wi);
            *pdf *= distanceSquared(ref.p, intr.p) / absDot(intr.n, -wi);
        }

        if (std::isinf(*pdf)) *pdf = 0.f;
        return intr;
    }

    // Compute coordinate system for sphere sampling
    Vector3f wc = normalize(pCenter - ref.p);
    Vector3f wcX, wcY;
    coordinateSystem(wc, &wcX, &wcY);

    // Sample sphere uniformly inside subtended cone

    // Compute $\theta$ and $\phi$ values for sample in cone
    Real sinThetaMax2 = radius * radius / distanceSquared(ref.p, pCenter);
    Real cosThetaMax = std::sqrt(std::max((Real)0, 1 - sinThetaMax2));
    Real cosTheta = (1 - u[0]) + u[0] * cosThetaMax;
    Real sinTheta = std::sqrt(std::max((Real)0, 1 - cosTheta * cosTheta));
    Real phi = u[1] * 2 * Pi;

    // Compute angle $\alpha$ from center of sphere to sampled point on surface
    Real dc = distance(ref.p, pCenter);
    Real ds = dc * cosTheta -
               std::sqrt(std::max(
                   (Real)0, radius * radius - dc * dc * sinTheta * sinTheta));
    Real cosAlpha = (dc * dc + radius * radius - ds * ds) / (2 * dc * radius);
    Real sinAlpha = std::sqrt(std::max((Real)0, 1 - cosAlpha * cosAlpha));

    // Compute surface normal and sampled point on sphere
    Vector3f nWorld = sphericalDirection(sinAlpha, cosAlpha, phi, -wcX, -wcY, -wc);
    Point3f pWorld = pCenter + radius * Point3f(nWorld.x, nWorld.y, nWorld.z);

    // Return _Interaction_ for sampled point on sphere
    Interaction it; it.p = pWorld;
    it.pfError = gamma(5) * abs((Vector3f)pWorld);
    it.n = Normal3f(nWorld);
    if (reverseNormals) it.n *= -1;

    // Uniform cone PDF.
    *pdf = 1 / (2 * Pi * (1 - cosThetaMax));

    return it;
}